

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::Q3BSPFileImporter::createMaterialMap(Q3BSPFileImporter *this,Q3BSPModel *pModel)

{
  sQ3BSPFace *psVar1;
  bool bVar2;
  sQ3BSPFace *psVar3;
  const_reference ppsVar4;
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *this_00;
  mapped_type *ppvVar5;
  reference ppVar6;
  _Self local_80;
  _Self local_78;
  FaceMapIt it;
  int lightMapId;
  int texId;
  sQ3BSPFace *pQ3BSPFace;
  size_t idx;
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *pCurFaceArray;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string key;
  Q3BSPModel *pModel_local;
  Q3BSPFileImporter *this_local;
  
  key.field_2._8_8_ = pModel;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator(&local_39);
  idx = 0;
  pQ3BSPFace = (sQ3BSPFace *)0x0;
  while( true ) {
    psVar1 = pQ3BSPFace;
    psVar3 = (sQ3BSPFace *)
             std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
             ::size((vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                     *)(key.field_2._8_8_ + 0x48));
    if (psVar3 <= psVar1) {
      std::__cxx11::string::~string((string *)local_38);
      return;
    }
    ppsVar4 = std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
              ::operator[]((vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                            *)(key.field_2._8_8_ + 0x48),(size_type)pQ3BSPFace);
    _lightMapId = *ppsVar4;
    it._M_node._4_4_ = _lightMapId->iTextureID;
    it._M_node._0_4_ = _lightMapId->iLightmapID;
    createKey(it._M_node._4_4_,(int)it._M_node,(string *)local_38);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
         ::find(&this->m_MaterialLookupMap,(key_type *)local_38);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
         ::end(&this->m_MaterialLookupMap);
    bVar2 = std::operator==(&local_80,&local_78);
    if (bVar2) {
      this_00 = (vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *
                )operator_new(0x18);
      std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::vector
                (this_00);
      idx = (size_t)this_00;
      ppvVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
                ::operator[](&this->m_MaterialLookupMap,(key_type *)local_38);
      *ppvVar5 = this_00;
    }
    else {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>
               ::operator*(&local_78);
      idx = (size_t)ppVar6->second;
    }
    if (idx == 0) break;
    if (idx != 0) {
      std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::
      push_back((vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *
                )idx,(value_type *)&lightMapId);
    }
    pQ3BSPFace = (sQ3BSPFace *)((long)&pQ3BSPFace->iTextureID + 1);
  }
  __assert_fail("nullptr != pCurFaceArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                ,0x220,
                "void Assimp::Q3BSPFileImporter::createMaterialMap(const Q3BSP::Q3BSPModel *)");
}

Assistant:

void Q3BSPFileImporter::createMaterialMap( const Q3BSP::Q3BSPModel *pModel ) {
    std::string key( "" );
    std::vector<sQ3BSPFace*> *pCurFaceArray = NULL;
    for ( size_t idx = 0; idx < pModel->m_Faces.size(); idx++ )
    {
        Q3BSP::sQ3BSPFace *pQ3BSPFace = pModel->m_Faces[ idx ];
        const int texId = pQ3BSPFace->iTextureID;
        const int lightMapId = pQ3BSPFace->iLightmapID;
        createKey( texId, lightMapId, key );
        FaceMapIt it = m_MaterialLookupMap.find( key );
        if ( m_MaterialLookupMap.end() == it ) {
            pCurFaceArray = new std::vector<Q3BSP::sQ3BSPFace*>;
            m_MaterialLookupMap[ key ] = pCurFaceArray;
        }
        else
        {
            pCurFaceArray = (*it).second;
        }
        ai_assert( nullptr != pCurFaceArray );
        if (nullptr != pCurFaceArray )
        {
            pCurFaceArray->push_back( pQ3BSPFace );
        }
    }
}